

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::UniformBufferStorageTestCase::execute
          (UniformBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ostringstream *this_00;
  bool bVar1;
  GLenum GVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  undefined1 local_1b0 [384];
  
  (*this->m_gl->bindBufferRange)
            (0x8a11,0,this->m_sparse_bo,(ulong)this->m_sparse_bo_data_start_offset,
             (ulong)this->m_sparse_bo_data_size);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1880);
  bVar7 = true;
  this_00 = (ostringstream *)(local_1b0 + 8);
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    if ((int)lVar8 == 2) {
      uVar4 = 0;
      uVar5 = 0;
    }
    else if ((int)lVar8 == 1) {
      uVar5 = this->m_sparse_bo_data_start_offset;
      uVar4 = this->m_sparse_bo_data_size >> 1;
    }
    else {
      uVar4 = this->m_sparse_bo_data_size;
      uVar5 = this->m_sparse_bo_data_start_offset;
    }
    (*this->m_gl->bufferPageCommitmentARB)(0x8a11,(ulong)uVar5,(ulong)uVar4,'\x01');
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18b1);
    (*this->m_gl->copyBufferSubData)(0x8f36,0x8f37,0,(ulong)uVar5,(ulong)uVar4);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glCopyBufferSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18b6);
    (*this->m_gl->useProgram)(this->m_po);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18ba);
    (*this->m_gl->beginTransformFeedback)(0);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18bd);
    (*this->m_gl->drawArrays)(0,0,this->m_n_ubo_uints);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18c1);
    (*this->m_gl->endTransformFeedback)();
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18c4);
    pvVar3 = (*this->m_gl->mapBuffer)(0x8c8e,35000);
    uVar6 = this->m_sparse_bo_data_start_offset;
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18cb);
    bVar1 = true;
    uVar9 = 0;
    while ((uVar9 < this->m_n_ubo_uints && (bVar1))) {
      if (*(uint *)((long)pvVar3 + uVar9 * 4) !=
          (uint)(uVar9 == 0 || uVar6 < uVar4 + uVar5 && uVar5 <= uVar6)) {
        local_1b0._0_8_ = this->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Invalid value (");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00,") found at index (");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00,"), instead of the expected value (");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00,"). Iteration index:(");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00,")");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        bVar1 = false;
      }
      uVar9 = uVar9 + 1;
      uVar6 = uVar6 + 4;
    }
    bVar7 = (bool)(bVar7 & bVar1);
    (*this->m_gl->unmapBuffer)(0x8c8e);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18fc);
    (*this->m_gl->clearBufferData)(0x8c8e,0x8229,0x1903,0x1401,"");
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glClearBufferData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x18ff);
    (*this->m_gl->bufferPageCommitmentARB)(0x8a11,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0x1902);
  }
  return bVar7;
}

Assistant:

bool UniformBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBufferRange(GL_UNIFORM_BUFFER, 0, /* index */
						 m_sparse_bo, m_sparse_bo_data_start_offset, m_sparse_bo_data_size);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferBase() call failed.");

	/* Run the test in three iterations:
	 *
	 * 1) Whole UBO storage is backed by physical backing.
	 * 2) Half the UBO storage is backed by physical backing.
	 * 3) None of the UBO storage is backed by physical backing.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool		 result_local			 = true;
		unsigned int ubo_commit_size		 = 0;
		unsigned int ubo_commit_start_offset = 0;

		switch (n_iteration)
		{
		case 0:
		{
			ubo_commit_size			= m_sparse_bo_data_size;
			ubo_commit_start_offset = m_sparse_bo_data_start_offset;

			break;
		}

		case 1:
		{
			DE_ASSERT((m_sparse_bo_data_size % 2) == 0);
			DE_ASSERT((m_sparse_bo_data_size % m_page_size) == 0);

			ubo_commit_size			= m_sparse_bo_data_size / 2;
			ubo_commit_start_offset = m_sparse_bo_data_start_offset;

			break;
		}

		case 2:
		{
			/* The default values do just fine */

			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		m_gl.bufferPageCommitmentARB(GL_UNIFORM_BUFFER, ubo_commit_start_offset, ubo_commit_size, GL_TRUE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

		/* Copy the UBO data */
		m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
							   ubo_commit_start_offset, ubo_commit_size);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

		/* Issue the draw call to execute the test */
		m_gl.useProgram(m_po);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

		m_gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBeginTransformFeedback() call failed.");

		m_gl.drawArrays(GL_POINTS, 0, /* first */
						m_n_ubo_uints);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays() call failed.");

		m_gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEndTransformFeedback() call failed.");

		/* Retrieve the data, verify the output */
		const unsigned int* result_data_ptr =
			(const unsigned int*)m_gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		unsigned int ubo_data_offset = m_sparse_bo_data_start_offset;

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBuffer() call failed.");

		for (unsigned int n_vertex = 0; n_vertex < m_n_ubo_uints && result_local;
			 ++n_vertex, ubo_data_offset = static_cast<unsigned int>(ubo_data_offset + sizeof(unsigned int)))
		{
			const bool is_ub_data_physically_backed = (ubo_data_offset >= ubo_commit_start_offset &&
													   ubo_data_offset < (ubo_commit_start_offset + ubo_commit_size)) ?
														  1 :
														  0;
			unsigned int	   expected_value  = -1;
			const unsigned int retrieved_value = result_data_ptr[n_vertex];

			if (is_ub_data_physically_backed)
			{
				expected_value = 1;
			}
			else
			{
				/* Read ops applied against non-committed sparse buffers should return 0, so the comparison
				 * performed in the vertex shader should result in 1 being written to the TF region.
				 */
				expected_value = (n_vertex == 0) ? 1 : 0;
			}

			if (expected_value != retrieved_value)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value "
															   "("
								   << retrieved_value << ") "
														 "found at index "
														 "("
								   << n_vertex << ")"
												  ", instead of the expected value "
												  "("
								   << expected_value << ")"
														". Iteration index:"
														"("
								   << n_iteration << ")" << tcu::TestLog::EndMessage;

				result_local = false;
			}
		}

		result &= result_local;

		/* Clean up in anticipation for the next iteration */
		static const unsigned char data_zero_r8 = 0;

		m_gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

		m_gl.clearBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, GL_R8, GL_RED, GL_UNSIGNED_BYTE, &data_zero_r8);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearBufferData() call failed.");

		m_gl.bufferPageCommitmentARB(GL_UNIFORM_BUFFER, 0, m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (all three iterations) */

	return result;
}